

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O2

int av1_calc_pframe_target_size_one_pass_vbr(AV1_COMP *cpi,FRAME_UPDATE_TYPE frame_update_type)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  undefined7 in_register_00000031;
  int iVar7;
  
  uVar6 = (uint)CONCAT71(in_register_00000031,frame_update_type);
  if ((uVar6 < 4) && (uVar6 != 1)) {
    iVar7 = (cpi->rc).avg_frame_bandwidth;
    iVar5 = (cpi->ppi->p_rc).baseline_gf_interval;
    lVar2 = (long)iVar7 * (long)iVar5 * 10;
  }
  else {
    iVar7 = (cpi->rc).avg_frame_bandwidth;
    iVar5 = (cpi->ppi->p_rc).baseline_gf_interval;
    lVar2 = (long)iVar5 * (long)iVar7;
  }
  lVar2 = lVar2 / (long)(iVar5 + 9);
  iVar5 = (cpi->rc).min_frame_bandwidth;
  iVar1 = iVar7 >> 5;
  if (iVar7 >> 5 < iVar5) {
    iVar1 = iVar5;
  }
  lVar3 = (long)iVar1;
  if (lVar2 < lVar3) {
    lVar2 = lVar3;
  }
  if ((frame_update_type & 0xfe) == 4) {
    lVar2 = lVar3;
  }
  lVar3 = (long)(cpi->rc).max_frame_bandwidth;
  if (lVar3 <= lVar2) {
    lVar2 = lVar3;
  }
  uVar4 = (ulong)(cpi->oxcf).rc_cfg.max_inter_bitrate_pct;
  if (uVar4 != 0) {
    lVar3 = (long)(uVar4 * (long)iVar7) / 100;
    if (lVar3 <= lVar2) {
      lVar2 = lVar3;
    }
  }
  return (int)lVar2;
}

Assistant:

int av1_calc_pframe_target_size_one_pass_vbr(
    const AV1_COMP *const cpi, FRAME_UPDATE_TYPE frame_update_type) {
  static const int af_ratio = 10;
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  int64_t target;
#if USE_ALTREF_FOR_ONE_PASS
  if (frame_update_type == KF_UPDATE || frame_update_type == GF_UPDATE ||
      frame_update_type == ARF_UPDATE) {
    target = ((int64_t)rc->avg_frame_bandwidth * p_rc->baseline_gf_interval *
              af_ratio) /
             (p_rc->baseline_gf_interval + af_ratio - 1);
  } else {
    target = ((int64_t)rc->avg_frame_bandwidth * p_rc->baseline_gf_interval) /
             (p_rc->baseline_gf_interval + af_ratio - 1);
  }
#else
  target = rc->avg_frame_bandwidth;
#endif
  return clamp_pframe_target_size(cpi, target, frame_update_type);
}